

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::rescale(raw_quasi_adaptive_huffman_data_model *this)

{
  uint uVar1;
  unsigned_short *puVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = this->m_total_syms;
  if ((ulong)uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    puVar2 = (this->m_sym_freq).m_p;
    uVar4 = 0;
    uVar3 = 0;
    do {
      uVar5 = puVar2[uVar4] + 1 >> 1;
      uVar3 = uVar3 + uVar5;
      puVar2[uVar4] = (unsigned_short)uVar5;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  this->m_total_count = uVar3;
  return;
}

Assistant:

void raw_quasi_adaptive_huffman_data_model::rescale()
   {
      uint total_freq = 0;

      for (uint i = 0; i < m_total_syms; i++)
      {
         uint freq = (m_sym_freq[i] + 1) >> 1;
         total_freq += freq;
         m_sym_freq[i] = static_cast<uint16>(freq);
      }

      m_total_count = total_freq;
   }